

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O1

FT_Error FT_GlyphLoader_CreateExtra(FT_GlyphLoader loader)

{
  uint uVar1;
  FT_Vector *__s;
  int iVar2;
  ulong uVar3;
  
  uVar1 = loader->max_points * 2;
  uVar3 = (ulong)uVar1;
  if (uVar1 == 0) {
    iVar2 = 0;
  }
  else {
    if (uVar1 < 0x8000000) {
      __s = (FT_Vector *)(*loader->memory->alloc)(loader->memory,uVar3 << 4);
      iVar2 = (uint)(__s == (FT_Vector *)0x0) << 6;
      goto LAB_001eadc2;
    }
    iVar2 = 10;
  }
  __s = (FT_Vector *)0x0;
LAB_001eadc2:
  if ((uVar3 != 0) && (iVar2 == 0)) {
    memset(__s,0,uVar3 << 4);
  }
  (loader->base).extra_points = __s;
  if (iVar2 == 0) {
    loader->use_extra = '\x01';
    (loader->base).extra_points2 = __s + loader->max_points;
    FT_GlyphLoader_Adjust_Points(loader);
  }
  return iVar2;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_GlyphLoader_CreateExtra( FT_GlyphLoader  loader )
  {
    FT_Error   error;
    FT_Memory  memory = loader->memory;


    if ( !FT_NEW_ARRAY( loader->base.extra_points, 2 * loader->max_points ) )
    {
      loader->use_extra          = 1;
      loader->base.extra_points2 = loader->base.extra_points +
                                   loader->max_points;

      FT_GlyphLoader_Adjust_Points( loader );
    }
    return error;
  }